

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void __thiscall bpwriter::format_with_padding(bpwriter *this,char *str,fmtopts *opts)

{
  ushort uVar1;
  size_t chars;
  
  uVar1 = *(ushort *)str;
  chars = utf8_ptr::s_len(str + 2,(ulong)uVar1);
  format_with_padding(this,str + 2,(ulong)uVar1,chars,opts);
  return;
}

Assistant:

void format_with_padding(VMG_ const char *str, const fmtopts &opts)
    {
        /* figure the byte length and get the buffer */
        size_t bytes = vmb_get_len(str);
        str += VMB_LEN;

        /* figure the character length */
        utf8_ptr p((char *)str);
        size_t chars = p.len(bytes);

        /* write it out */
        format_with_padding(vmg_ str, bytes, chars, opts);
    }